

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O1

void __thiscall ArgTest_WStringArg_Test::TestBody(ArgTest_WStringArg_Test *this)

{
  mock_visitor<const_wchar_t_*> *pmVar1;
  size_t sVar2;
  MockSpec<test_result_(const_wchar_t_*)> *pMVar3;
  MockSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)> *pMVar4;
  basic_string_view<wchar_t> value;
  basic_string_view<wchar_t> value_00;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  arg;
  wchar_t str_data [5];
  StrictMock<mock_visitor<const_wchar_t_*>_> visitor;
  allocator local_149;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  local_148;
  _func_int *local_128;
  undefined8 uStack_120;
  undefined4 local_118;
  _func_int **local_108;
  size_t sStack_100;
  _func_int *local_f8 [2];
  StrictMock<mock_visitor<const_wchar_t_*>_> local_e8;
  
  local_128 = (_func_int *)0x6500000074;
  uStack_120 = 0x7400000073;
  local_118 = 0;
  sVar2 = wcslen((wchar_t *)&local_128);
  testing::StrictMock<mock_visitor<const_wchar_t_*>_>::StrictMock(&local_e8);
  testing::Matcher<const_wchar_t_*>::Matcher
            ((Matcher<const_wchar_t_*> *)&local_148,(wchar_t *)&local_128);
  pmVar1 = &local_e8.super_mock_visitor<const_wchar_t_*>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar3 = testing::internal::FunctionMocker<test_result_(const_wchar_t_*)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<const_wchar_t_*> *)&local_148);
  testing::internal::MockSpec<test_result_(const_wchar_t_*)>::InternalExpectedAt
            (pMVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x16d,"visitor","visit(cstr)");
  local_148.value_.field_0.double_value = (double)&PTR__MatcherBase_001d6020;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_wchar_t_*>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<const_wchar_t_*>_> *)
             ((long)&local_148.value_.field_0 + 8));
  local_148.type_ = cstring_type;
  local_148.value_.field_0.pointer = &local_128;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<wchar_t_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_e8,&local_148);
  testing::StrictMock<mock_visitor<const_wchar_t_*>_>::~StrictMock(&local_e8);
  testing::StrictMock<mock_visitor<const_wchar_t_*>_>::StrictMock(&local_e8);
  testing::Matcher<const_wchar_t_*>::Matcher
            ((Matcher<const_wchar_t_*> *)&local_148,(wchar_t *)&local_128);
  pmVar1 = &local_e8.super_mock_visitor<const_wchar_t_*>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar3 = testing::internal::FunctionMocker<test_result_(const_wchar_t_*)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<const_wchar_t_*> *)&local_148);
  testing::internal::MockSpec<test_result_(const_wchar_t_*)>::InternalExpectedAt
            (pMVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x16e,"visitor","visit(cstr)");
  local_148.value_.field_0.double_value = (double)&PTR__MatcherBase_001d6020;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_wchar_t_*>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<const_wchar_t_*>_> *)
             ((long)&local_148.value_.field_0 + 8));
  local_148.type_ = cstring_type;
  local_148.value_.field_0.pointer = &local_128;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<wchar_t_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_e8,&local_148);
  testing::StrictMock<mock_visitor<const_wchar_t_*>_>::~StrictMock(&local_e8);
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_>::StrictMock
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *)&local_e8);
  value.size_ = sVar2;
  value.data_ = (wchar_t *)&local_128;
  testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>::Matcher
            ((Matcher<fmt::v5::basic_string_view<wchar_t>_> *)&local_148,value);
  pmVar1 = &local_e8.super_mock_visitor<const_wchar_t_*>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar4 = testing::internal::FunctionMocker<test_result_(fmt::v5::basic_string_view<wchar_t>)>::
           With((FunctionMocker<test_result_(fmt::v5::basic_string_view<wchar_t>)> *)pmVar1,
                (Matcher<fmt::v5::basic_string_view<wchar_t>_> *)&local_148);
  testing::internal::MockSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)>::InternalExpectedAt
            (pMVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x16f,"visitor","visit(sref)");
  local_148.value_.field_0.double_value = (double)&PTR__MatcherBase_001d6050;
  testing::internal::
  linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_> *)
             ((long)&local_148.value_.field_0 + 8));
  std::__cxx11::wstring::wstring((wstring *)&local_108,(wchar_t *)&local_128,&local_149);
  local_148.type_ = string_type;
  local_148.value_.field_0.pointer = local_108;
  local_148.value_.field_0.string.size = sStack_100;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *)&local_e8,&local_148
            );
  if (local_108 != local_f8) {
    operator_delete(local_108);
  }
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_>::~StrictMock
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *)&local_e8);
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_>::StrictMock
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *)&local_e8);
  value_00.size_ = sVar2;
  value_00.data_ = (wchar_t *)&local_128;
  testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>::Matcher
            ((Matcher<fmt::v5::basic_string_view<wchar_t>_> *)&local_148,value_00);
  pmVar1 = &local_e8.super_mock_visitor<const_wchar_t_*>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar4 = testing::internal::FunctionMocker<test_result_(fmt::v5::basic_string_view<wchar_t>)>::
           With((FunctionMocker<test_result_(fmt::v5::basic_string_view<wchar_t>)> *)pmVar1,
                (Matcher<fmt::v5::basic_string_view<wchar_t>_> *)&local_148);
  testing::internal::MockSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)>::InternalExpectedAt
            (pMVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x170,"visitor","visit(sref)");
  local_148.value_.field_0.double_value = (double)&PTR__MatcherBase_001d6050;
  testing::internal::
  linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_> *)
             ((long)&local_148.value_.field_0 + 8));
  local_148.value_.field_0.string.size = wcslen((wchar_t *)&local_128);
  local_148.type_ = string_type;
  local_148.value_.field_0.pointer = &local_128;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *)&local_e8,&local_148
            );
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_>::~StrictMock
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *)&local_e8);
  return;
}

Assistant:

TEST(ArgTest, WStringArg) {
  wchar_t str_data[] = L"test";
  wchar_t *str = str_data;
  const wchar_t *cstr = str;

  fmt::wstring_view sref(str);
  CHECK_ARG_(wchar_t, cstr, str);
  CHECK_ARG_(wchar_t, cstr, cstr);
  CHECK_ARG_(wchar_t, sref, std::wstring(str));
  CHECK_ARG_(wchar_t, sref, fmt::wstring_view(str));
}